

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::default_cost_type<long_double>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (default_cost_type<long_double> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  longdouble lVar1;
  longdouble p2y;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  _Var2;
  pointer ppVar3;
  bool bVar4;
  type plVar5;
  reference pvVar6;
  iterator iVar7;
  difference_type dVar8;
  baryonyx *this_00;
  pointer ppVar9;
  iterator iVar10;
  pointer __first;
  pointer plVar11;
  longdouble *plVar12;
  long in_RCX;
  long in_R8;
  longdouble in_ST0;
  int local_16c;
  int i_2;
  longdouble div;
  int local_150;
  int i_1;
  longdouble value;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  local_e8;
  pair<long_double,_int> *local_e0;
  pair<long_double,_int> *local_d8;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  local_d0;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  local_c8;
  pair<long_double,_int> *local_c0;
  pair<long_double,_int> *local_b8;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  local_b0;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  local_a8;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  next;
  iterator end;
  iterator begin;
  pair<long_double,_int> local_78;
  int local_50 [2];
  int i;
  allocator<std::pair<long_double,_int>_> local_39;
  undefined1 local_38 [8];
  vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> r;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng_local;
  int n_local;
  default_cost_type<long_double> *this_local;
  
  r.super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)rng;
  std::allocator<std::pair<long_double,_int>_>::allocator(&local_39);
  std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::vector
            ((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> *)
             local_38,(long)n,&local_39);
  std::allocator<std::pair<long_double,_int>_>::~allocator(&local_39);
  for (local_50[0] = 0; local_50[0] != n; local_50[0] = local_50[0] + 1) {
    plVar5 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       (&this->linear_elements,(long)local_50[0]);
    std::pair<long_double,_int>::pair<long_double_&,_int_&,_true>(&local_78,plVar5,local_50);
    pvVar6 = std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
             ::operator[]((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                           *)local_38,(long)local_50[0]);
    std::pair<long_double,_int>::operator=(pvVar6,&local_78);
  }
  iVar7 = std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
          begin((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                 *)local_38);
  std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::end
            ((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> *)
             local_38);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,baryonyx::itm::default_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>
            (iVar7._M_current);
  end = std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
        begin((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> *)
              local_38);
  next._M_current =
       (pair<long_double,_int> *)
       std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::end
                 ((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                   *)local_38);
  local_b0._M_current =
       (pair<long_double,_int> *)
       std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
       begin((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> *)
             local_38);
  local_a8 = __gnu_cxx::
             __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
             ::operator++(&local_b0,0);
  while (bVar4 = __gnu_cxx::
                 operator==<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                           (&local_a8,&next), ((bVar4 ^ 0xffU) & 1) != 0) {
    ppVar9 = __gnu_cxx::
             __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
             ::operator->(&local_a8);
    lVar1 = ppVar9->first;
    ppVar9 = __gnu_cxx::
             __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
             ::operator->(&end);
    if ((lVar1 != ppVar9->first) || (NAN(lVar1) || NAN(ppVar9->first))) {
      local_b8 = end._M_current;
      local_c0 = local_a8._M_current;
      dVar8 = std::
              distance<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
                        ((__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                          )end._M_current,local_a8);
      ppVar3 = r.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (1 < dVar8) {
        local_c8._M_current = end._M_current;
        local_d0._M_current = local_a8._M_current;
        ppVar9 = __gnu_cxx::
                 __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                 ::operator->(&end);
        lVar1 = ppVar9->first;
        ppVar9 = __gnu_cxx::
                 __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                 ::operator->(&local_a8);
        random_epsilon_unique<long_double,__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
                  (local_c8,local_d0,(random_engine *)ppVar3,lVar1,ppVar9->first);
      }
      end._M_current = local_a8._M_current;
    }
    __gnu_cxx::
    __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
    ::operator++(&local_a8);
  }
  local_d8 = end._M_current;
  local_e0 = next._M_current;
  dVar8 = std::
          distance<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
                    ((__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                      )end._M_current,next);
  if (1 < dVar8) {
    local_e8._M_current =
         (pair<long_double,_int> *)
         std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
         begin((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> *
               )local_38);
    bVar4 = __gnu_cxx::
            operator==<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                      (&end,&local_e8);
    ppVar3 = r.
             super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar7 = end;
    _Var2 = next;
    if (bVar4) {
      ppVar9 = __gnu_cxx::
               __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
               ::operator->(&end);
      lVar1 = ppVar9->first;
      ppVar9 = __gnu_cxx::
               __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
               ::operator->(&end);
      random_epsilon_unique<long_double,__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
                ((__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                  )iVar7._M_current,_Var2,(random_engine *)ppVar3,lVar1,
                 (longdouble)1 + ppVar9->first);
    }
    else {
      pvVar6 = std::
               vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
               front((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                      *)local_38);
      lVar1 = pvVar6->first;
      iVar7 = std::
              vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
              begin((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                     *)local_38);
      this_00 = (baryonyx *)
                std::
                distance<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
                          ((__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                            )iVar7._M_current,
                           (__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                            )end._M_current);
      ppVar9 = __gnu_cxx::
               __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
               ::operator->(&end);
      p2y = ppVar9->first;
      iVar7 = std::
              vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
              begin((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                     *)local_38);
      iVar10 = std::
               vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
               end((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                    *)local_38);
      dVar8 = std::
              distance<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
                        ((__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                          )iVar7._M_current,
                         (__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                          )iVar10._M_current);
      linearize<long,long_double>((longdouble *)0x0,this_00,dVar8,lVar1,in_RCX,p2y,in_R8);
      ppVar3 = r.
               super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      iVar7 = end;
      _Var2 = next;
      ppVar9 = __gnu_cxx::
               __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
               ::operator->(&end);
      random_epsilon_unique<long_double,__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
                ((__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                  )iVar7._M_current,_Var2,(random_engine *)ppVar3,ppVar9->first,in_ST0);
    }
  }
  iVar7 = std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
          begin((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                 *)local_38);
  iVar10 = std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
           end((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> *
               )local_38);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,baryonyx::itm::default_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>
            (iVar7._M_current,iVar10._M_current);
  for (local_150 = 0; local_150 != n; local_150 = local_150 + 1) {
    pvVar6 = std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
             ::operator[]((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                           *)local_38,(long)local_150);
    lVar1 = pvVar6->first;
    plVar5 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                       (&this->linear_elements,(long)local_150);
    *plVar5 = lVar1;
  }
  __first = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::get
                      (&this->linear_elements);
  plVar11 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::get
                      (&this->linear_elements);
  plVar12 = std::max_element<long_double*>(__first,plVar11 + n);
  lVar1 = *plVar12;
  bVar4 = std::isnormal(lVar1);
  if (bVar4) {
    for (local_16c = 0; local_16c != n; local_16c = local_16c + 1) {
      plVar5 = std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::operator[]
                         (&this->linear_elements,(long)local_16c);
      *plVar5 = *plVar5 / lVar1;
    }
  }
  std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::~vector
            ((vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> *)
             local_38);
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        auto begin = r.begin();
        auto end = r.end();
        auto next = r.begin()++;
        for (; next != end; ++next) {
            if (next->first != begin->first) {
                if (std::distance(begin, next) > 1)
                    random_epsilon_unique(
                      begin, next, rng, begin->first, next->first);

                begin = next;
            }
        }

        if (std::distance(begin, end) > 1) {
            if (begin == r.begin()) {
                random_epsilon_unique(
                  begin, end, rng, begin->first, begin->first + 1);
            } else {
                auto value = linearize(std::ptrdiff_t(0),
                                       r.front().first,
                                       std::distance(r.begin(), begin),
                                       begin->first,
                                       std::distance(r.begin(), r.end()));

                random_epsilon_unique(begin, end, rng, begin->first, value);
            }
        }

        // Reorder the vector according to the variable index, so, it
        // restores the initial order.

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.second < rhs.second;
        });

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;

        // Finally we compute the l+oo norm.

        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);
        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }